

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O2

GroupInfo __thiscall UnifiedRegex::RegexPattern::GetGroup(RegexPattern *this,int groupId)

{
  Matcher *pMVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  GroupInfo GVar5;
  
  if (groupId == 0) {
LAB_00d3992a:
    if ((uint)groupId < (uint)((this->rep).unified.program.ptr)->numGroups) goto LAB_00d39984;
  }
  else {
    pMVar1 = (this->rep).unified.matcher.ptr;
    if ((pMVar1 == (Matcher *)0x0) || (((pMVar1->groupInfos).ptr)->length == 0xffffffff)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                         ,0x80,"(groupId == 0 || WasLastMatchSuccessful())",
                         "groupId == 0 || WasLastMatchSuccessful()");
      if (!bVar3) goto LAB_00d39999;
      *puVar4 = 0;
    }
    if (-1 < groupId) goto LAB_00d3992a;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                     ,0x81,"(groupId >= 0 && groupId < NumGroups())",
                     "groupId >= 0 && groupId < NumGroups()");
  if (!bVar3) {
LAB_00d39999:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar4 = 0;
LAB_00d39984:
  GVar5 = Matcher::GetGroup((this->rep).unified.matcher.ptr,groupId);
  return GVar5;
}

Assistant:

GroupInfo RegexPattern::GetGroup(int groupId) const
    {
        Assert(groupId == 0 || WasLastMatchSuccessful());
        Assert(groupId >= 0 && groupId < NumGroups());
        return rep.unified.matcher->GetGroup(groupId);
    }